

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::startThreads(FastText *this,TrainCallback *callback)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this_00;
  __int_type_conflict _Var3;
  ulong uVar4;
  size_type sVar5;
  exception_ptr *__other;
  long in_RDI;
  float fVar6;
  undefined1 auVar7 [12];
  exception_ptr exception;
  int32_t i_1;
  real progress;
  int64_t ntokens;
  int32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  TrainCallback *in_stack_00000290;
  int32_t in_stack_0000029c;
  FastText *in_stack_000002a0;
  value_type *in_stack_fffffffffffffef8;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffff00;
  exception_ptr *this_01;
  function<void_(float,_float,_double,_double,_long)> *in_stack_ffffffffffffff08;
  exception_ptr *__o;
  FastText *in_stack_ffffffffffffff10;
  exception_ptr this_02;
  type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined1 local_c0 [8];
  exception_ptr local_b8;
  exception_ptr local_b0;
  int local_a4;
  float local_a0;
  int local_9c;
  duration<long,std::ratio<1l,1000l>> local_98 [8];
  int64_t local_90;
  undefined4 local_84;
  undefined8 local_80;
  int local_70;
  ostream *in_stack_ffffffffffffffa0;
  real in_stack_ffffffffffffffa8;
  real in_stack_ffffffffffffffac;
  FastText *in_stack_ffffffffffffffb0;
  int local_3c;
  vector<std::thread,_std::allocator<std::thread>_> local_38;
  exception_ptr local_20;
  undefined8 local_18;
  
  local_18 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(in_RDI + 0x60) = local_18;
  std::__atomic_base<long>::operator=
            ((__atomic_base<long> *)in_stack_ffffffffffffff10,
             (__int_type_conflict)in_stack_ffffffffffffff08);
  std::atomic<float>::operator=
            ((atomic<float> *)in_stack_ffffffffffffff00,
             (float)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  std::__exception_ptr::exception_ptr::exception_ptr(&local_20,(nullptr_t)0x0);
  std::__exception_ptr::exception_ptr::operator=
            ((exception_ptr *)in_stack_ffffffffffffff10,(exception_ptr *)in_stack_ffffffffffffff08);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_ffffffffffffff00);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1baa96);
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1baaa0);
  if (peVar2->thread < 2) {
    trainThread(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
  }
  else {
    local_3c = 0;
    while (in_stack_ffffffffffffff34 = local_3c,
          peVar2 = std::
                   __shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1baacd), in_stack_ffffffffffffff34 < peVar2->thread) {
      local_70 = local_3c;
      std::function<void_(float,_float,_double,_double,_long)>::function
                ((function<void_(float,_float,_double,_double,_long)> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff08);
      std::thread::
      thread<fasttext::FastText::startThreads(std::function<void(float,float,double,double,long)>const&)::__0,,void>
                ((thread *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::thread::~thread((thread *)0x1bab4d);
      startThreads(std::function<void(float,float,double,double,long)>const&)::$_0::~__0
                ((type *)0x1bab5a);
      local_3c = local_3c + 1;
    }
  }
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1babfa);
  local_90 = Dictionary::ntokens(this_00);
  while (bVar1 = keepTraining(in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08), bVar1)
  {
    local_9c = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_98,&local_9c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    fVar6 = std::atomic::operator_cast_to_float((atomic<float> *)0x1bac5e);
    if ((0.0 <= fVar6) &&
       (peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1bac76), 1 < peVar2->verbose)) {
      _Var3 = std::__atomic_base::operator_cast_to_long
                        ((__atomic_base<long> *)in_stack_ffffffffffffff08);
      peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1baca6);
      local_a0 = (float)_Var3 / (float)(peVar2->epoch * local_90);
      std::operator<<((ostream *)&std::cerr,"\r");
      std::atomic::operator_cast_to_float((atomic<float> *)0x1bacfa);
      printInfo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                in_stack_ffffffffffffffa0);
    }
  }
  for (local_a4 = 0; uVar4 = (ulong)local_a4,
      sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&local_38), uVar4 < sVar5
      ; local_a4 = local_a4 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_38,(long)local_a4);
    std::thread::join();
  }
  bVar1 = std::__exception_ptr::exception_ptr::operator_cast_to_bool
                    ((exception_ptr *)(in_RDI + 0x78));
  if (bVar1) {
    __other = (exception_ptr *)(in_RDI + 0x78);
    __o = &local_b0;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)in_stack_ffffffffffffff00,__other);
    this_01 = &local_b8;
    std::__exception_ptr::exception_ptr::exception_ptr(this_01,(nullptr_t)0x0);
    std::__exception_ptr::exception_ptr::operator=((exception_ptr *)in_stack_ffffffffffffff10,__o);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_01);
    this_02._M_exception_object = local_c0;
    std::__exception_ptr::exception_ptr::exception_ptr(this_01,__other);
    auVar7 = std::rethrow_exception(this_02);
    local_84 = auVar7._8_4_;
    local_80 = auVar7._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr(this_01);
    std::__exception_ptr::exception_ptr::~exception_ptr(this_01);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_02._M_exception_object);
    _Unwind_Resume(local_80);
  }
  peVar2 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bae2a);
  if (0 < peVar2->verbose) {
    std::operator<<((ostream *)&std::cerr,"\r");
    std::atomic::operator_cast_to_float((atomic<float> *)0x1bae56);
    printInfo(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffa0);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void FastText::startThreads(const TrainCallback& callback) {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  if (args_->thread > 1) {
    for (int32_t i = 0; i < args_->thread; i++) {
      threads.push_back(std::thread([=]() { trainThread(i, callback); }));
    }
  } else {
    // webassembly can't instantiate `std::thread`
    trainThread(0, callback);
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < threads.size(); i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}